

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O3

SUNErrCode
SUNAdaptController_SetParams_ImExGus
          (SUNAdaptController C,sunrealtype k1e,sunrealtype k2e,sunrealtype k1i,sunrealtype k2i)

{
  sunrealtype *psVar1;
  
  psVar1 = (sunrealtype *)C->content;
  psVar1[2] = k1e;
  psVar1[3] = k2e;
  *psVar1 = k1i;
  psVar1[1] = k2i;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_ImExGus(SUNAdaptController C,
                                                sunrealtype k1e, sunrealtype k2e,
                                                sunrealtype k1i, sunrealtype k2i)
{
  SUNFunctionBegin(C->sunctx);
  SACIMEXGUS_K1E(C) = k1e;
  SACIMEXGUS_K2E(C) = k2e;
  SACIMEXGUS_K1I(C) = k1i;
  SACIMEXGUS_K2I(C) = k2i;
  return SUN_SUCCESS;
}